

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O1

void __thiscall
Inline::SetupInlineeFrame
          (Inline *this,Func *inlinee,Instr *inlineeStart,ArgSlot actualCount,Opnd *functionObject)

{
  Func *func;
  code *pcVar1;
  bool bVar2;
  byte bVar3;
  undefined4 *puVar4;
  StackSym *stackSym;
  SymOpnd *newDst;
  Instr *this_00;
  Opnd *this_01;
  undefined6 in_register_0000000a;
  long lVar5;
  Opnd *local_78;
  Opnd *srcs [3];
  ArgSlot local_36 [4];
  ArgSlot argSlots [3];
  
  local_36[0] = actualCount + 1;
  local_36[1] = actualCount + 2;
  local_36[2] = actualCount + 3;
  srcs[2] = (Opnd *)this;
  IR::IntConstOpnd::New
            (CONCAT62(in_register_0000000a,actualCount) & 0xffffffff,TyInt16,inlinee,true);
  srcs[0] = (Opnd *)0x0;
  srcs[1] = &IR::AddrOpnd::NewNull(inlinee)->super_Opnd;
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  lVar5 = 0;
  do {
    stackSym = SymTable::GetArgSlotSym(inlinee->m_symTable,local_36[lVar5]);
    stackSym->field_0x19 = stackSym->field_0x19 | 0x40;
    Func::SetArgOffset((Func *)srcs[2]->_vptr_Opnd,stackSym,
                       (*(int *)&srcs[2]->m_kind + (int)lVar5) * 8);
    newDst = IR::SymOpnd::New(&stackSym->super_Sym,0,(&DAT_010281a0)[lVar5],inlinee);
    this_00 = IR::Instr::New(InlineeMetaArg,inlinee);
    IR::Instr::SetDst(this_00,&newDst->super_Opnd);
    this_01 = srcs[lVar5 + -1];
    if (this_01 != (Opnd *)0x0) {
      if (this_00->m_src1 != (Opnd *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                           ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
        if (!bVar2) goto LAB_00552b4c;
        *puVar4 = 0;
      }
      func = this_00->m_func;
      if (this_01->isDeleted == true) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x14,"(!isDeleted)","Using deleted operand");
        if (!bVar2) {
LAB_00552b4c:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar4 = 0;
      }
      bVar3 = this_01->field_0xb;
      if ((bVar3 & 2) != 0) {
        this_01 = IR::Opnd::Copy(this_01,func);
        bVar3 = this_01->field_0xb;
      }
      this_01->field_0xb = bVar3 | 2;
      this_00->m_src1 = this_01;
    }
    IR::Instr::InsertBefore(inlineeStart,this_00);
    if (lVar5 == 0) {
      Func::SetInlineeFrameStartSym(inlinee,stackSym);
    }
    lVar5 = lVar5 + 1;
    if (lVar5 == 3) {
      return;
    }
  } while( true );
}

Assistant:

void
Inline::SetupInlineeFrame(Func *inlinee, IR::Instr *inlineeStart, Js::ArgSlot actualCount, IR::Opnd *functionObject)
{
    Js::ArgSlot argSlots[Js::Constants::InlineeMetaArgCount] = {
        actualCount + 1u, /* argc */
        actualCount + 2u, /* function object */
        actualCount + 3u  /* arguments object slot */
    };

    IR::Opnd *srcs[Js::Constants::InlineeMetaArgCount] = {
        IR::IntConstOpnd::New(actualCount, TyInt16, inlinee, true /*dontEncode*/),

        /*
         * Don't initialize this slot with the function object yet. In compat mode we evaluate
         * the target only after evaluating all arguments. Having this SymOpnd here ensures it gets
         * the correct slot in the frame. Lowerer fills this slot with the function object just
         * before entering the inlinee when we're sure we've evaluated the target in all modes.
         */
        nullptr,

        IR::AddrOpnd::NewNull(inlinee)
    };

    const IRType types[Js::Constants::InlineeMetaArgCount] = {
        TyMachReg,
        TyVar,
        TyMachReg
    };

    for (unsigned instrIndex = 0; instrIndex < Js::Constants::InlineeMetaArgCount; instrIndex++)
    {
        StackSym    *stackSym = inlinee->m_symTable->GetArgSlotSym(argSlots[instrIndex]);
        stackSym->m_isInlinedArgSlot = true;
        this->topFunc->SetArgOffset(stackSym, (currentInlineeFrameSlot + instrIndex) * MachPtr);
        IR::SymOpnd *symOpnd  = IR::SymOpnd::New(stackSym, 0, types[instrIndex], inlinee);

        IR::Instr   *instr    = IR::Instr::New(Js::OpCode::InlineeMetaArg, inlinee);
        instr->SetDst(symOpnd);
        if (srcs[instrIndex])
        {
            instr->SetSrc1(srcs[instrIndex]);
        }
        inlineeStart->InsertBefore(instr);

        if (instrIndex == 0)
        {
            inlinee->SetInlineeFrameStartSym(stackSym);
        }
    }
}